

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec,uchar *tweak32)

{
  uint uVar1;
  uint uVar2;
  secp256k1_scalar *in_RSI;
  int ret;
  int overflow;
  secp256k1_scalar term;
  secp256k1_scalar *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  int iVar4;
  uint in_stack_ffffffffffffffec;
  
  iVar4 = 0;
  uVar3 = 0;
  secp256k1_scalar_set_b32
            (in_RSI,(uchar *)((ulong)in_stack_ffffffffffffffec << 0x20),
             (int *)(ulong)in_stack_ffffffffffffffe0);
  uVar2 = (uint)((iVar4 != 0 ^ 0xffU) & 1);
  uVar1 = secp256k1_eckey_privkey_tweak_add
                    ((secp256k1_scalar *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffd8);
  uVar2 = uVar2 & uVar1;
  secp256k1_scalar_clear((secp256k1_scalar *)0x10477a);
  return uVar2;
}

Assistant:

static int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    int ret = 0;

    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    ret = (!overflow) & secp256k1_eckey_privkey_tweak_add(sec, &term);
    secp256k1_scalar_clear(&term);
    return ret;
}